

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_socketpair.c
# Opt level: O0

nng_err nni_socket_pair(int *fds)

{
  int iVar1;
  int *piVar2;
  int rv;
  int *fds_local;
  
  iVar1 = socketpair(1,1,0,fds);
  if (iVar1 == 0) {
    fds_local._4_4_ = NNG_OK;
  }
  else {
    piVar2 = __errno_location();
    fds_local._4_4_ = nni_plat_errno(*piVar2);
  }
  return fds_local._4_4_;
}

Assistant:

nng_err
nni_socket_pair(int fds[2])
{
	int rv;
	rv = socketpair(PF_UNIX, SOCK_STREAM, 0, fds);
	if (rv != 0) {
		return (nni_plat_errno(errno));
	}

#ifdef SO_NOSIGPIPE
	int set = 1;
	setsockopt(
	    fds[0], SOL_SOCKET, SO_NOSIGPIPE, (void *) &set, sizeof(int));
	setsockopt(
	    fds[1], SOL_SOCKET, SO_NOSIGPIPE, (void *) &set, sizeof(int));
#endif

	return (0);
}